

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::GLES2ThreadTest::CopyTexImage2D::CopyTexImage2D
          (CopyTexImage2D *this,SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *texture,GLint level,
          GLint internalFormat,GLint x,GLint y,GLsizei width,GLsizei height,GLint border,
          bool useSync,bool serverSync)

{
  Texture *pTVar1;
  SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> local_60;
  SharedPtr<deqp::egl::GLES2ThreadTest::Object> local_50 [2];
  undefined1 local_2a;
  undefined1 local_29;
  GLint local_28;
  bool serverSync_local;
  GLint GStack_24;
  bool useSync_local;
  GLint y_local;
  GLint x_local;
  GLint internalFormat_local;
  GLint level_local;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *texture_local;
  CopyTexImage2D *this_local;
  
  local_29 = useSync;
  local_2a = serverSync;
  local_28 = y;
  GStack_24 = x;
  y_local = internalFormat;
  x_local = level;
  _internalFormat_local = texture;
  texture_local = (SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *)this;
  Operation::Operation(&this->super_Operation,"CopyTexImage2D",useSync,serverSync);
  (this->super_Operation).super_Operation._vptr_Operation =
       (_func_int **)&PTR__CopyTexImage2D_032676c8;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::SharedPtr(&this->m_texture,texture);
  this->m_level = x_local;
  this->m_internalFormat = y_local;
  this->m_x = GStack_24;
  this->m_y = local_28;
  this->m_width = width;
  this->m_height = height;
  this->m_border = border;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Object>::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>
            (local_50,&this->m_texture);
  Operation::modifyGLObject(&this->super_Operation,local_50);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Object>::~SharedPtr(local_50);
  pTVar1 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::operator->(texture);
  pTVar1->isDefined = true;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>::SharedPtr(&local_60);
  pTVar1 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::operator->(texture);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>::operator=(&pTVar1->sourceImage,&local_60);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>::~SharedPtr(&local_60);
  return;
}

Assistant:

CopyTexImage2D::CopyTexImage2D (SharedPtr<Texture> texture, GLint level, GLint internalFormat, GLint x, GLint y, GLsizei width, GLsizei height, GLint border, bool useSync, bool serverSync)
	: Operation			("CopyTexImage2D", useSync, serverSync)
	, m_texture			(texture)
	, m_level			(level)
	, m_internalFormat	(internalFormat)
	, m_x				(x)
	, m_y				(y)
	, m_width			(width)
	, m_height			(height)
	, m_border			(border)
{
	modifyGLObject(SharedPtr<Object>(m_texture));
	texture->isDefined = true;

	// Orphang texture
	texture->sourceImage = SharedPtr<EGLImage>();
}